

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

int write_signer_digest_algos(CBB *digest_algos_set,void *arg)

{
  int iVar1;
  env_md_ctx_st *ctx;
  EVP_MD *md;
  signer_info_data *si_data;
  void *arg_local;
  CBB *digest_algos_set_local;
  
  ctx = bssl::internal::
        StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
        ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               *)((long)arg + 8));
  md = EVP_MD_CTX_get0_md(ctx);
  iVar1 = EVP_marshal_digest_algorithm_no_params(digest_algos_set,md);
  return iVar1;
}

Assistant:

static int write_signer_digest_algos(CBB *digest_algos_set, void *arg) {
  auto *si_data = static_cast<struct signer_info_data *>(arg);
  // https://www.rfc-editor.org/rfc/rfc5754.html#section-2
  // "Implementations MUST generate SHA2 AlgorithmIdentifiers with absent
  //  parameters."
  return EVP_marshal_digest_algorithm_no_params(
      digest_algos_set, EVP_MD_CTX_get0_md(si_data->sign_ctx.get()));
}